

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void plot_masked_sprite_16px(tgestate_t *state,vischar_t *vischar)

{
  long in_RSI;
  uint8_t x;
  uint8_t in_stack_0000004f;
  tgestate_t *in_stack_00000050;
  uint8_t in_stack_0000006f;
  tgestate_t *in_stack_00000070;
  
  if (((byte)*(undefined2 *)(in_RSI + 0x38) & 7) < 4) {
    plot_masked_sprite_16px_right(in_stack_00000050,in_stack_0000004f);
  }
  else {
    plot_masked_sprite_16px_left(in_stack_00000070,in_stack_0000006f);
  }
  return;
}

Assistant:

void plot_masked_sprite_16px(tgestate_t *state, vischar_t *vischar)
{
  uint8_t x; /* was A */

  ASSERT_VISCHAR_VALID(vischar);

  x = vischar->isopos.x & 7;
  if (x < 4)
    plot_masked_sprite_16px_right(state, x); /* was fallthrough */
  else
    plot_masked_sprite_16px_left(state, x);
}